

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

string * __thiscall
mocker::ir::fmtInst_abi_cxx11_
          (string *__return_storage_ptr__,ir *this,shared_ptr<mocker::ir::IRInst> *inst)

{
  ir *piVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  shared_ptr<mocker::ir::Addr> *addr_00;
  shared_ptr<mocker::ir::Addr> *addr_01;
  shared_ptr<mocker::ir::Addr> *addr_02;
  shared_ptr<mocker::ir::Addr> *addr_03;
  shared_ptr<mocker::ir::Addr> *addr_04;
  shared_ptr<mocker::ir::Addr> *addr_05;
  shared_ptr<mocker::ir::Addr> *addr_06;
  shared_ptr<mocker::ir::Addr> *addr_07;
  shared_ptr<mocker::ir::Addr> *addr_08;
  shared_ptr<mocker::ir::Addr> *addr_09;
  shared_ptr<mocker::ir::Addr> *addr_10;
  shared_ptr<mocker::ir::Addr> *addr_11;
  shared_ptr<mocker::ir::Addr> *addr_12;
  shared_ptr<mocker::ir::Addr> *addr_13;
  shared_ptr<mocker::ir::Addr> *addr_14;
  shared_ptr<mocker::ir::Addr> *addr_15;
  shared_ptr<mocker::ir::Addr> *addr_16;
  shared_ptr<mocker::ir::Addr> *extraout_RDX;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_00;
  shared_ptr<mocker::ir::Addr> *addr_17;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_01;
  shared_ptr<mocker::ir::Addr> *psVar4;
  shared_ptr<mocker::ir::Addr> *addr_18;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_02;
  shared_ptr<mocker::ir::Addr> *addr_19;
  shared_ptr<mocker::ir::Addr> *addr_20;
  shared_ptr<mocker::ir::Addr> *addr_21;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer this_01;
  long lVar5;
  shared_ptr<mocker::ir::Addr> *addr;
  ir *this_02;
  shared_ptr<mocker::ir::Store> sVar6;
  shared_ptr<mocker::ir::Branch> sVar7;
  shared_ptr<mocker::ir::Ret> sVar8;
  shared_ptr<mocker::ir::Alloca> p_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  shared_ptr<mocker::ir::ArithUnaryInst> p_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  shared_ptr<mocker::ir::Assign> p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  shared_ptr<mocker::ir::Store> p_4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  shared_ptr<mocker::ir::Phi> p_13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  string local_288;
  shared_ptr<mocker::ir::Branch> p_6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  shared_ptr<mocker::ir::RelationInst> p_14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  shared_ptr<mocker::ir::ArithBinaryInst> p_9;
  shared_ptr<mocker::ir::Comment> p_10;
  undefined1 local_1e0 [16];
  undefined4 local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  undefined1 local_1b8 [48];
  element_type *peStack_188;
  undefined4 local_180;
  element_type *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  undefined1 local_168 [48];
  undefined8 uStack_138;
  undefined4 local_130;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  undefined1 local_118 [48];
  pointer ppStack_e8;
  undefined4 local_e0;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [48];
  element_type *peStack_98;
  undefined4 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  dyc<mocker::ir::Deleted,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&p_10,(shared_ptr<mocker::ir::IRInst> *)this);
  lVar5 = CONCAT44(p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _4_4_,p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_4_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (lVar5 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&p_10);
    return __return_storage_ptr__;
  }
  dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)this);
  if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)&p_1,(shared_ptr<mocker::ir::IRInst> *)this);
    if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_2,
                 &((p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Definition).dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      fmtAddr_abi_cxx11_((string *)&p_10,(ir *)&p_2,addr_02);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                     " = ");
      std::__cxx11::string::~string((string *)&p_10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      fmtAddr_abi_cxx11_((string *)&p_2,
                         (ir *)&(p_1.
                                 super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->operand,addr_03);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&p_10);
      std::__cxx11::string::~string((string *)&p_2);
LAB_0018c107:
      this_00 = &p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      goto LAB_0018c183;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)&p_2,(shared_ptr<mocker::ir::IRInst> *)this);
    if (p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_1,
                 &((p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Definition).dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      fmtAddr_abi_cxx11_((string *)&p_10,(ir *)&p_1,addr_04);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                     " = alloca");
LAB_0018c167:
      std::__cxx11::string::~string((string *)&p_10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
LAB_0018c17e:
      this_00 = &p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      goto LAB_0018c183;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::Malloc,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)this);
    if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      sVar6 = dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
                        ((ir *)&p_4,(shared_ptr<mocker::ir::IRInst> *)this);
      if (p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        fmtAddr_abi_cxx11_((string *)&p_1,
                           (ir *)&(p_4.
                                   super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->addr,
                           (shared_ptr<mocker::ir::Addr> *)
                           sVar6.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi._M_pi);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2,
                       "store ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&p_1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2," "
                      );
        fmtAddr_abi_cxx11_((string *)&p,
                           (ir *)&(p_4.
                                   super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->val,addr_07);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
        std::__cxx11::string::~string((string *)&p);
        std::__cxx11::string::~string((string *)&p_10);
        std::__cxx11::string::~string((string *)&p_2);
        std::__cxx11::string::~string((string *)&p_1);
        this_00 = &p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        goto LAB_0018c183;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)this);
      if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        sVar7 = dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>
                          ((ir *)&p_6,(shared_ptr<mocker::ir::IRInst> *)this);
        if (p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          fmtAddr_abi_cxx11_((string *)&p_4,
                             (ir *)&(p_6.
                                     super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->condition,
                             (shared_ptr<mocker::ir::Addr> *)
                             sVar7.
                             super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._M_pi);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                         "br ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p_4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p," "
                        );
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Label,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_14,
                     &((p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->then).
                      super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>);
          fmtAddr_abi_cxx11_(&local_288,(ir *)&p_14,addr_10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,
                         &local_288);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2,
                         " ");
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Label,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_228,
                     &((p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->else_).
                      super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>);
          fmtAddr_abi_cxx11_((string *)&p_13,(ir *)&local_228,addr_11);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_13)
          ;
          std::__cxx11::string::~string((string *)&p_13);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length);
          std::__cxx11::string::~string((string *)&p_10);
          std::__cxx11::string::~string((string *)&p_2);
          std::__cxx11::string::~string((string *)&local_288);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_14.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&p_1);
          std::__cxx11::string::~string((string *)&p);
          std::__cxx11::string::~string((string *)&p_4);
          this_00 = &p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          goto LAB_0018c183;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)&p_2,(shared_ptr<mocker::ir::IRInst> *)this);
        if (p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Label,void>
                    ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_1,
                     (__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> *)
                     &((p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Definition).dest);
          fmtAddr_abi_cxx11_((string *)&p_10,(ir *)&p_1,addr_12);
          std::operator+(__return_storage_ptr__,"jump ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10)
          ;
          goto LAB_0018c167;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        sVar8 = dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>const&>
                          ((ir *)&p_2,(shared_ptr<mocker::ir::IRInst> *)this);
        if (p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)&p_9,(shared_ptr<mocker::ir::IRInst> *)this);
          if (p_9.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) {
            if ((fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::opName_abi_cxx11_ ==
                 '\0') &&
               (iVar2 = __cxa_guard_acquire(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                             ::opName_abi_cxx11_), iVar2 != 0)) {
              s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2
                           ,"bitor",5);
              p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0;
              p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_
                   = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  == &local_318) {
                local_1e0._8_8_ = local_318._8_8_;
              }
              else {
                p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
              }
              p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_318._M_local_buf[0] = '\0';
              p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_318;
              s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1
                           ,"bitand",6);
              local_1c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8;
              local_1d0 = 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr == &local_2f8) {
                local_1b8._8_8_ = local_2f8._8_8_;
              }
              else {
                local_1c8._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
              }
              local_1c0 = p_1.
                          super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
              p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_2f8._M_local_buf[0] = '\0';
              p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)&local_2f8;
              s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                           "xor",3);
              local_1b8._24_8_ = local_1b8 + 0x28;
              local_1b8._16_4_ = 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  &local_2d8) {
                peStack_188 = (element_type *)local_2d8._8_8_;
              }
              else {
                local_1b8._24_8_ =
                     p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              }
              local_1b8._32_8_ =
                   p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_2d8._M_local_buf[0] = '\0';
              p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_2d8;
              s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_4
                           ,"shl",3);
              local_178 = (element_type *)local_168;
              local_180 = 3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  &local_2b8) {
                local_168._8_8_ = local_2b8._8_8_;
              }
              else {
                local_178 = p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr;
              }
              local_170 = p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_2b8._M_local_buf[0] = '\0';
              p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_2b8;
              s_abi_cxx11_(&local_288,"shr",3);
              local_168._24_8_ = local_168 + 0x28;
              local_168._16_4_ = 4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p == &local_288.field_2) {
                uStack_138 = local_288.field_2._8_8_;
              }
              else {
                local_168._24_8_ = local_288._M_dataplus._M_p;
              }
              local_168._32_8_ = local_288._M_string_length;
              local_288._M_string_length = 0;
              local_288.field_2._M_local_buf[0] = '\0';
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
              s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_13,"add",3);
              local_128 = (element_type *)local_118;
              local_130 = 5;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  &local_298) {
                local_118._8_8_ = local_298._8_8_;
              }
              else {
                local_128 = p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr;
              }
              local_120 = p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_298._M_local_buf[0] = '\0';
              p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_298;
              s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_6
                           ,"sub",3);
              local_118._24_8_ = local_118 + 0x28;
              local_118._16_4_ = 6;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  == &local_258) {
                ppStack_e8 = (pointer)local_258._8_8_;
              }
              else {
                local_118._24_8_ =
                     p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              }
              local_118._32_8_ =
                   p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_258._M_local_buf[0] = '\0';
              p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_258;
              s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_14,"mul",3);
              local_d8 = (element_type *)local_c8;
              local_e0 = 7;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_14.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr == &local_238) {
                local_c8._8_8_ = local_238._8_8_;
              }
              else {
                local_d8 = p_14.
                           super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
              }
              local_d0 = p_14.
                         super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
              p_14.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_238._M_local_buf[0] = '\0';
              p_14.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_238;
              s_abi_cxx11_(&local_228,"div",3);
              local_c8._24_8_ = local_c8 + 0x28;
              local_c8._16_4_ = 8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p == &local_228.field_2) {
                peStack_98 = (element_type *)local_228.field_2._8_8_;
              }
              else {
                local_c8._24_8_ = local_228._M_dataplus._M_p;
              }
              local_c8._32_8_ = local_228._M_string_length;
              local_228._M_string_length = 0;
              local_228.field_2._M_local_buf[0] = '\0';
              local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
              s_abi_cxx11_(&local_68,"mod",3);
              local_88 = &local_78;
              local_90 = 9;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p == &local_68.field_2) {
                local_78._8_8_ = local_68.field_2._8_8_;
              }
              else {
                local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_68._M_dataplus._M_p;
              }
              local_80._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length;
              local_68._M_string_length = 0;
              local_68.field_2._M_local_buf[0] = '\0';
              local_40._M_len = 10;
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              local_40._M_array = (iterator)&p_10;
              SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::SmallMap(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                          opName_abi_cxx11_,&local_40);
              lVar5 = 0x170;
              do {
                std::__cxx11::string::~string
                          ((string *)
                           ((long)&p_10.
                                   super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar5));
                lVar5 = lVar5 + -0x28;
              } while (lVar5 != -0x20);
              std::__cxx11::string::~string((string *)&local_68);
              std::__cxx11::string::~string((string *)&local_228);
              std::__cxx11::string::~string((string *)&p_14);
              std::__cxx11::string::~string((string *)&p_6);
              std::__cxx11::string::~string((string *)&p_13);
              std::__cxx11::string::~string((string *)&local_288);
              std::__cxx11::string::~string((string *)&p_4);
              std::__cxx11::string::~string((string *)&p);
              std::__cxx11::string::~string((string *)&p_1);
              std::__cxx11::string::~string((string *)&p_2);
              __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::~SmallMap,
                           &fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                            opName_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                                   opName_abi_cxx11_);
            }
            std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<mocker::ir::Reg,void>
                      ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_14,
                       &((p_9.
                          super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_Definition).dest.
                        super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
            fmtAddr_abi_cxx11_(&local_288,(ir *)&p_14,addr_13);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_4
                           ,&local_288," = ");
            local_228._M_dataplus._M_p._0_4_ =
                 (p_9.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->op;
            pbVar3 = SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::at(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                           opName_abi_cxx11_,(OpType *)&local_228);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_4
                           ,pbVar3);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                           " ");
            fmtAddr_abi_cxx11_((string *)&p_13,
                               (ir *)&(p_9.
                                       super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->lhs,addr_14);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &p_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_13);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_2," ");
            fmtAddr_abi_cxx11_((string *)&p_6,
                               (ir *)&(p_9.
                                       super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->rhs,addr_15);
            std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_6);
            std::__cxx11::string::~string((string *)&p_6);
            std::__cxx11::string::~string((string *)&p_10);
            std::__cxx11::string::~string((string *)&p_2);
            std::__cxx11::string::~string((string *)&p_13);
            std::__cxx11::string::~string((string *)&p_1);
            std::__cxx11::string::~string((string *)&p);
            std::__cxx11::string::~string((string *)&p_4);
            std::__cxx11::string::~string((string *)&local_288);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p_14.
                        super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            this_00 = &p_9.
                       super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            goto LAB_0018c183;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_9.
                      super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          dyc<mocker::ir::Comment,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)&p_10,(shared_ptr<mocker::ir::IRInst> *)this);
          if (CONCAT44(p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._4_4_,
                       p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._0_4_) == 0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            dyc<mocker::ir::AttachedComment,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)&p_10,(shared_ptr<mocker::ir::IRInst> *)this);
            if (CONCAT44(p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._4_4_,
                         p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_4_) == 0) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                        ((ir *)&p_1,(shared_ptr<mocker::ir::IRInst> *)this);
              if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&p_1.
                            super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                          ((ir *)&p_13,(shared_ptr<mocker::ir::IRInst> *)this);
                if (p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>const&>
                            ((ir *)&p_14,(shared_ptr<mocker::ir::IRInst> *)this);
                  if (p_14.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr == (element_type *)0x0) {
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&p_14.
                                super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/printer.cpp"
                                  ,0x6a,
                                  "std::string mocker::ir::fmtInst(const std::shared_ptr<IRInst> &)"
                                 );
                  }
                  if (fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                      opName_abi_cxx11_ == '\0') {
                    iVar2 = __cxa_guard_acquire(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                                 ::opName_abi_cxx11_);
                    if (iVar2 != 0) {
                      s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p_2,"ne",2);
                      p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0;
                      p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._0_4_ = 1;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr == &local_318) {
                        local_1e0._8_8_ = local_318._8_8_;
                      }
                      else {
                        p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi =
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                      }
                      p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_318._M_local_buf[0] = '\0';
                      p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           = (element_type *)&local_318;
                      s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p_1,"eq",2);
                      local_1c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8;
                      local_1d0 = 0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)p_1.
                             super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr == &local_2f8) {
                        local_1b8._8_8_ = local_2f8._8_8_;
                      }
                      else {
                        local_1c8._M_pi =
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             p_1.
                             super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                      }
                      local_1c0 = p_1.
                                  super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
                      p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_2f8._M_local_buf[0] = '\0';
                      p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)&local_2f8;
                      s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p,"lt",2);
                      local_1b8._24_8_ = local_1b8 + 0x28;
                      local_1b8._16_4_ = 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr == &local_2d8) {
                        peStack_188 = (element_type *)local_2d8._8_8_;
                      }
                      else {
                        local_1b8._24_8_ =
                             p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                      }
                      local_1b8._32_8_ =
                           p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
                      p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_2d8._M_local_buf[0] = '\0';
                      p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           (element_type *)&local_2d8;
                      s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p_4,"le",2);
                      local_178 = (element_type *)local_168;
                      local_180 = 4;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr == &local_2b8) {
                        local_168._8_8_ = local_2b8._8_8_;
                      }
                      else {
                        local_178 = p_4.
                                    super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr;
                      }
                      local_170 = p_4.
                                  super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                      p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_2b8._M_local_buf[0] = '\0';
                      p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           (element_type *)&local_2b8;
                      s_abi_cxx11_(&local_288,"gt",2);
                      local_168._24_8_ = local_168 + 0x28;
                      local_168._16_4_ = 3;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_288._M_dataplus._M_p == &local_288.field_2) {
                        uStack_138 = local_288.field_2._8_8_;
                      }
                      else {
                        local_168._24_8_ = local_288._M_dataplus._M_p;
                      }
                      local_168._32_8_ = local_288._M_string_length;
                      local_288._M_string_length = 0;
                      local_288.field_2._M_local_buf[0] = '\0';
                      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                      s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p_13,"ge",2);
                      local_128 = (element_type *)local_118;
                      local_130 = 5;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr == &local_298) {
                        local_118._8_8_ = local_298._8_8_;
                      }
                      else {
                        local_128 = p_13.
                                    super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr;
                      }
                      local_120 = p_13.
                                  super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                      p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_298._M_local_buf[0] = '\0';
                      p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
                      p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           (element_type *)&local_298;
                      p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           = (element_type *)&p_10;
                      SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::SmallMap(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                                  opName_abi_cxx11_,
                                 (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&p_6);
                      lVar5 = 0xd0;
                      do {
                        std::__cxx11::string::~string
                                  ((string *)
                                   ((long)&p_10.
                                           super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + lVar5));
                        lVar5 = lVar5 + -0x28;
                      } while (lVar5 != -0x20);
                      std::__cxx11::string::~string((string *)&p_13);
                      std::__cxx11::string::~string((string *)&local_288);
                      std::__cxx11::string::~string((string *)&p_4);
                      std::__cxx11::string::~string((string *)&p);
                      std::__cxx11::string::~string((string *)&p_1);
                      std::__cxx11::string::~string((string *)&p_2);
                      __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ::~SmallMap,
                                   &fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                                    opName_abi_cxx11_,&__dso_handle);
                      __cxa_guard_release(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                           ::opName_abi_cxx11_);
                    }
                  }
                  std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<mocker::ir::Reg,void>
                            ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_228
                             ,&((p_14.
                                 super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super_Definition).dest.
                               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
                  fmtAddr_abi_cxx11_(&local_288,(ir *)&local_228,addr_19);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_4,&local_288," = ");
                  local_68._M_dataplus._M_p._0_4_ =
                       (p_14.
                        super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->op;
                  pbVar3 = SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::at(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                                 opName_abi_cxx11_,(OpType *)&local_68);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&p_4,pbVar3);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&p," ");
                  fmtAddr_abi_cxx11_((string *)&p_13,
                                     (ir *)&(p_14.
                                             super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->lhs,addr_20);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&p_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_13);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&p_2," ");
                  fmtAddr_abi_cxx11_((string *)&p_6,
                                     (ir *)&(p_14.
                                             super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->rhs,addr_21);
                  std::operator+(__return_storage_ptr__,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&p_6);
                  std::__cxx11::string::~string((string *)&p_6);
                  std::__cxx11::string::~string((string *)&p_10);
                  std::__cxx11::string::~string((string *)&p_2);
                  std::__cxx11::string::~string((string *)&p_13);
                  std::__cxx11::string::~string((string *)&p_1);
                  std::__cxx11::string::~string((string *)&p);
                  std::__cxx11::string::~string((string *)&p_4);
                  std::__cxx11::string::~string((string *)&local_288);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_228._M_string_length);
                  this_00 = &p_14.
                             super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount;
                }
                else {
                  std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<mocker::ir::Reg,void>
                            ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_2,
                             &((p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_Definition).dest.
                              super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
                  fmtAddr_abi_cxx11_((string *)&p_10,(ir *)&p_2,addr_17);
                  std::operator+(__return_storage_ptr__,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&p_10," = phi ");
                  std::__cxx11::string::~string((string *)&p_10);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  local_48 = ((p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->options).
                             super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  psVar4 = extraout_RDX_01;
                  for (this_01 = ((p_13.
                                   super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->options).
                                 super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; this_01 != local_48;
                      this_01 = this_01 + 1) {
                    fmtAddr_abi_cxx11_((string *)&p_4,(ir *)this_01,psVar4);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p,"[ ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p_4);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&p," ");
                    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<mocker::ir::Label,void>
                              ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_6,
                               &(this_01->second).
                                super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>);
                    fmtAddr_abi_cxx11_(&local_288,(ir *)&p_6,addr_18);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&p_1,&local_288);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&p_2," ] ");
                    std::__cxx11::string::append((string *)__return_storage_ptr__);
                    std::__cxx11::string::~string((string *)&p_10);
                    std::__cxx11::string::~string((string *)&p_2);
                    std::__cxx11::string::~string((string *)&local_288);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&p_6.
                                super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::__cxx11::string::~string((string *)&p_1);
                    std::__cxx11::string::~string((string *)&p);
                    std::__cxx11::string::~string((string *)&p_4);
                    psVar4 = extraout_RDX_02;
                  }
                  this_00 = &p_13.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                }
                goto LAB_0018c183;
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              __return_storage_ptr__->_M_string_length = 0;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
              if (((p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Definition).dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<mocker::ir::Reg,void>
                          ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p,
                           &((p_1.
                              super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_Definition).dest.
                            super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
                fmtAddr_abi_cxx11_((string *)&p_2,(ir *)&p,addr_16);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&p_2," = ");
                std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&p_10);
                std::__cxx11::string::~string((string *)&p_10);
                std::__cxx11::string::~string((string *)&p_2);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &p_10,"call ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &(p_1.
                               super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->op);
              std::__cxx11::string::append((string *)__return_storage_ptr__);
              std::__cxx11::string::~string((string *)&p_10);
              piVar1 = (ir *)p_1.
                             super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr[1].super_Definition._vptr_Definition;
              psVar4 = extraout_RDX;
              for (this_02 = *(ir **)&p_1.
                                      super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr[1].super_IRInst.type; this_02 != piVar1;
                  this_02 = this_02 + 0x10) {
                fmtAddr_abi_cxx11_((string *)&p_2,this_02,psVar4);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p_10," ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p_2);
                std::__cxx11::string::append((string *)__return_storage_ptr__);
                std::__cxx11::string::~string((string *)&p_10);
                std::__cxx11::string::~string((string *)&p_2);
                psVar4 = extraout_RDX_00;
              }
              goto LAB_0018c107;
            }
            std::operator+(__return_storage_ptr__,"; ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (CONCAT44(p_10.
                                     super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,
                                     p_10.
                                     super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_4_) + 0x10));
          }
          else {
            std::operator+(__return_storage_ptr__,"; ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (CONCAT44(p_10.
                                     super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,
                                     p_10.
                                     super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_4_) + 0x10));
          }
          this_00 = &p_10.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          goto LAB_0018c183;
        }
        if (((p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                       "void",4);
        }
        else {
          fmtAddr_abi_cxx11_((string *)&p_10,
                             (ir *)&((p_2.
                                      super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->super_Definition).dest,
                             (shared_ptr<mocker::ir::Addr> *)
                             sVar8.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._M_pi);
        }
        std::operator+(__return_storage_ptr__,"ret ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10);
        std::__cxx11::string::~string((string *)&p_10);
        goto LAB_0018c17e;
      }
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_4,
                 &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Definition).dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      fmtAddr_abi_cxx11_((string *)&p_2,(ir *)&p_4,addr_08);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2,
                     " = load ");
      fmtAddr_abi_cxx11_((string *)&p_1,
                         (ir *)&(p.
                                 super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->operand,addr_09);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1);
    }
    else {
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_4,
                 &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Definition).dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      fmtAddr_abi_cxx11_((string *)&p_2,(ir *)&p_4,addr_05);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2,
                     " = malloc ");
      fmtAddr_abi_cxx11_((string *)&p_1,
                         (ir *)&(p.
                                 super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->operand,addr_06);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1);
    }
  }
  else {
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_4,
               &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Definition).dest.
                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
    fmtAddr_abi_cxx11_((string *)&p_2,(ir *)&p_4,addr_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_2,
                   " = assign ");
    fmtAddr_abi_cxx11_((string *)&p_1,
                       (ir *)&(p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->operand,addr_01);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1);
  }
  std::__cxx11::string::~string((string *)&p_1);
  std::__cxx11::string::~string((string *)&p_10);
  std::__cxx11::string::~string((string *)&p_2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_00 = &p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
LAB_0018c183:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string fmtInst(const std::shared_ptr<IRInst> &inst) {
  using namespace std::string_literals;

  if (dyc<Deleted>(inst)) {
    return "";
  }
  if (auto p = dyc<Assign>(inst)) {
    return fmtAddr(p->getDest()) + " = assign " + fmtAddr(p->getOperand());
  }
  if (auto p = dyc<ArithUnaryInst>(inst)) {
    auto res = fmtAddr(p->getDest()) + " = ";
    res += (p->getOp() == ArithUnaryInst::Neg ? "neg" : "bitnot");
    res += " " + fmtAddr(p->getOperand());
    return res;
  }
  if (auto p = dyc<Alloca>(inst)) {
    return fmtAddr(p->getDest()) + " = alloca";
  }
  if (auto p = dyc<Malloc>(inst)) {
    return fmtAddr(p->getDest()) + " = malloc " + fmtAddr(p->getSize());
  }
  if (auto p = dyc<Store>(inst)) {
    return "store " + fmtAddr(p->getAddr()) + " " + fmtAddr(p->getVal());
  }
  if (auto p = dyc<Load>(inst)) {
    return fmtAddr(p->getDest()) + " = load " + fmtAddr(p->getAddr());
  }
  if (auto p = dyc<Branch>(inst)) {
    return "br " + fmtAddr(p->getCondition()) + " " + fmtAddr(p->getThen()) +
           " " + fmtAddr(p->getElse());
  }
  if (auto p = dyc<Jump>(inst)) {
    return "jump " + fmtAddr(p->getLabel());
  }
  if (auto p = dyc<Ret>(inst)) {
    return "ret " + (p->getVal() ? fmtAddr(p->getVal()) : "void"s);
  }
  if (auto p = dyc<ArithBinaryInst>(inst)) {
    static SmallMap<ArithBinaryInst::OpType, std::string> opName{
        {ArithBinaryInst::BitOr, "bitor"s},
        {ArithBinaryInst::BitAnd, "bitand"s},
        {ArithBinaryInst::Xor, "xor"s},
        {ArithBinaryInst::Shl, "shl"s},
        {ArithBinaryInst::Shr, "shr"s},
        {ArithBinaryInst::Add, "add"s},
        {ArithBinaryInst::Sub, "sub"s},
        {ArithBinaryInst::Mul, "mul"s},
        {ArithBinaryInst::Div, "div"s},
        {ArithBinaryInst::Mod, "mod"s},
    };
    return fmtAddr(p->getDest()) + " = " + opName.at(p->getOp()) + " " +
           fmtAddr(p->getLhs()) + " " + fmtAddr(p->getRhs());
  }
  if (auto p = dyc<Comment>(inst)) {
    return "; " + p->getContent();
  }
  if (auto p = dyc<AttachedComment>(inst)) {
    return "; " + p->getContent();
  }
  if (auto p = dyc<Call>(inst)) {
    std::string res;
    if (p->getDest())
      res = fmtAddr(p->getDest()) + " = ";
    res += "call " + p->getFuncName();
    for (auto &addr : p->getArgs())
      res += " " + fmtAddr(addr);
    return res;
  }
  if (auto p = dyc<Phi>(inst)) {
    std::string res = fmtAddr(p->getDest()) + " = phi ";
    for (auto &kv : p->getOptions())
      res += "[ " + fmtAddr(kv.first) + " " + fmtAddr(kv.second) + " ] ";
    return res;
  }
  if (auto p = dyc<RelationInst>(inst)) {
    static SmallMap<RelationInst::OpType, std::string> opName{
        {RelationInst::OpType::Ne, "ne"s}, {RelationInst::OpType::Eq, "eq"s},
        {RelationInst::OpType::Lt, "lt"s}, {RelationInst::OpType::Le, "le"s},
        {RelationInst::OpType::Gt, "gt"s}, {RelationInst::OpType::Ge, "ge"s}};
    return fmtAddr(p->getDest()) + " = " + opName.at(p->getOp()) + " " +
           fmtAddr(p->getLhs()) + " " + fmtAddr(p->getRhs());
  }
  assert(false);
}